

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O1

void Qentem::Test::TestLoopUTag1(QTest *test)

{
  SizeT *pSVar1;
  Value<char16_t> *pVVar2;
  uint uVar3;
  long lVar4;
  TagBit *pTVar5;
  undefined8 uVar6;
  char16_t *pcVar7;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 *paVar8;
  Value<char16_t> *pVVar9;
  long lVar10;
  Array<Qentem::Tags::TagBit> tags_cache_5;
  StringStream<char16_t> stream;
  Value<char16_t> value2;
  Value<char16_t> value1;
  StringStream<char16_t> ss;
  Value<char16_t> value3;
  Array<Qentem::Tags::TagBit> local_d8;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_c8;
  undefined8 local_b8;
  char16_t *local_b0;
  SizeT local_a8;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_98;
  char local_88;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_78;
  char local_68;
  StringStream<char16_t> local_58;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_48;
  char local_38;
  
  local_58.storage_ = (char16_t *)0x0;
  local_58.length_ = 0;
  local_58.capacity_ = 0;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_38 = '\0';
  local_48.array_.storage_ = (Value<char16_t> *)0x0;
  local_48._8_8_ = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
  local_68 = '\x03';
  local_c8.number_ = (QNumber64)0x64;
  local_b8 = CONCAT71(local_b8._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.number_ = (QNumber64)0xffffffffffffffce;
  local_b8 = CONCAT71(local_b8._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  String<char16_t>::String((String<char16_t> *)&local_98.array_,L"Qentem");
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.array_.storage_ = local_98.array_.storage_;
  local_c8.array_.index_ = local_98.array_.index_;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8 = CONCAT71(local_b8._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  uVar6 = local_98.array_.storage_;
  if (local_98.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_98.number_);
  }
  operator_delete((void *)uVar6);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = CONCAT71(local_b8._1_7_,8);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = CONCAT71(local_b8._1_7_,9);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = CONCAT71(local_b8._1_7_,10);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.number_ = (QNumber64)0x3;
  local_b8 = CONCAT71(local_b8._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,
             (Array<Qentem::Tags::TagBit> *)&local_98.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,(Array<Qentem::Tags::TagBit> *)&local_98.array_,
             (Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[41]>
            (test,&local_58,(char16_t (*) [41])L"100, -50, Qentem, true, false, null, 3, ",0xb19);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>";
  local_a8 = 0x4e;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>",
             0x4e,(Array<Qentem::Tags::TagBit> *)&local_98.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,(Array<Qentem::Tags::TagBit> *)&local_98.array_,
             (Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[74]>
            (test,&local_58,
             (char16_t (*) [74])
             L"100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 ",0xb1e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
  local_68 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
  local_68 = '\x03';
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8 = CONCAT71(local_b8._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_c8.number_ = (QNumber64)0x1;
  local_b8 = CONCAT71(local_b8._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  lVar10 = 0;
  do {
    lVar4 = lVar10 + 1;
    lVar10 = lVar10 + 1;
  } while (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
           [lVar4] != L'\0');
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = 
  L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
  ;
  local_a8 = (SizeT)lVar10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
             ,local_a8,(Array<Qentem::Tags::TagBit> *)&local_98.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,(Array<Qentem::Tags::TagBit> *)&local_98.array_,
             (Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[29]>
            (test,&local_58,(char16_t (*) [29])L"(0: 0) (0: 1) (1: 0) (1: 1) ",0xb29);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  lVar10 = 0;
  do {
    lVar4 = lVar10 + 1;
    lVar10 = lVar10 + 1;
  } while (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
           [lVar4] != L'\0');
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = 
  L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
  ;
  local_a8 = (SizeT)lVar10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
             ,local_a8,(Array<Qentem::Tags::TagBit> *)&local_98.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,(Array<Qentem::Tags::TagBit> *)&local_98.array_,
             (Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[81]>
            (test,&local_58,
             (char16_t (*) [81])
             L"(0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) ",
             0xb2f);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  lVar10 = 0;
  do {
    lVar4 = lVar10 + 1;
    lVar10 = lVar10 + 1;
  } while (L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
           [lVar4] != L'\0');
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = 
  L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
  ;
  local_a8 = (SizeT)lVar10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
             ,local_a8,(Array<Qentem::Tags::TagBit> *)&local_98.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,(Array<Qentem::Tags::TagBit> *)&local_98.array_,
             (Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[209]>
            (test,&local_58,
             (char16_t (*) [209])
             L"(0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) "
             ,0xb37);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_c8.array_,(StringStream<char16_t> *)&local_98.array_,
             L"[100, -50, \"A\", true, false, null]",0x22);
  uVar6 = local_98.array_.storage_;
  if (local_98.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_98.number_);
  }
  operator_delete((void *)uVar6);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_78.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_98.array_,(StringStream<char16_t> *)&local_c8.array_,
             L"{\"k-1\": 4, \"k-2\":1.5, \"k-3\":\"ABC\", \"k-4\":true, \"k-5\":false, \"k-6\":null}"
             ,0x47);
  uVar6 = local_c8.array_.storage_;
  if (local_c8.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_c8.number_);
  }
  operator_delete((void *)uVar6);
  if (local_38 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
    local_38 = '\x02';
  }
  paVar8 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                      ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                       &local_48.array_,L"arr1",4)->field_0;
  if (paVar8 != &local_78) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar8->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar8->array_,(Value<char16_t> *)&local_78.array_);
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb44);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_98.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb48);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x3f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb4c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  if (local_38 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
    local_38 = '\x02';
  }
  paVar8 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                      ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                       &local_48.array_,L"arr1",4)->field_0;
  if (paVar8 != &local_98) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar8->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar8->array_,(Value<char16_t> *)&local_98.array_);
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x3f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb52);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  if (local_38 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
    local_38 = '\x02';
  }
  paVar8 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                      ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                       &local_48.array_,L"arr1",4)->field_0;
  if (paVar8 != &local_78) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar8->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar8->array_,(Value<char16_t> *)&local_78.array_);
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\" >{var:loop1-value}, </loop>";
  local_a8 = 0x35;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\" >{var:loop1-value}, </loop>",0x35,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_78.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb59);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_98.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb5d);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>";
  local_a8 = 0x3e;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>",0x3e,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb61);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  if (local_38 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
    local_38 = '\x02';
  }
  paVar8 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                      ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                       &local_48.array_,L"arr1",4)->field_0;
  if (paVar8 != &local_98) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar8->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar8->array_,(Value<char16_t> *)&local_98.array_);
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x3f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb67);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
  local_38 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
  local_38 = 2;
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_48.array_
                      ,L"arr1",4);
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"arr2",4
                     );
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  paVar8 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                      ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"arr3",
                       4)->field_0;
  if (paVar8 != &local_78) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar8->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar8->array_,(Value<char16_t> *)&local_78.array_);
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x4b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x4b
             ,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb6f);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
  local_38 = 0;
  pVVar9 = Value<char16_t>::operator[]((Value<char16_t> *)&local_48.array_,0);
  pVVar9 = Value<char16_t>::operator[](pVVar9,0);
  if ((pVVar9->type_ == Object) && (local_88 == '\x02')) {
    HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
              ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,
               (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_98.array_);
  }
  else {
    if (pVVar9->type_ != Array) {
      Value<char16_t>::reset(pVVar9);
      pVVar9->type_ = Array;
    }
    uVar3 = (pVVar9->field_0).array_.capacity_;
    if ((pVVar9->field_0).array_.index_ == uVar3) {
      Array<Qentem::Value<char16_t>_>::resize
                ((Array<Qentem::Value<char16_t>_> *)pVVar9,(uVar3 == 0 | uVar3) * 2);
    }
    pVVar2 = (pVVar9->field_0).array_.storage_ + (pVVar9->field_0).array_.index_;
    (pVVar2->field_0).array_.storage_ = (Value<char16_t> *)0x0;
    *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
    pVVar2->type_ = Undefined;
    Value<char16_t>::copyValue(pVVar2,(Value<char16_t> *)&local_98.array_);
    pSVar1 = &(pVVar9->field_0).array_.index_;
    *pSVar1 = *pSVar1 + 1;
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_a8 = 0x41;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>",0x41,&local_d8
            );
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb76);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
  local_38 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
  local_38 = 2;
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_48.array_
                      ,L"k1",2);
  pVVar9 = Value<char16_t>::operator[](pVVar9,0);
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  paVar8 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                      ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"k3",2)
            ->field_0;
  if (paVar8 != &local_78) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar8->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar8->array_,(Value<char16_t> *)&local_78.array_);
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>";
  local_a8 = 0x44;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>",0x44,
             &local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,&local_58,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb7d);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_48.array_);
  local_38 = 0;
  pVVar9 = Value<char16_t>::operator[]((Value<char16_t> *)&local_48.array_,0);
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"k2",2);
  if ((pVVar9->type_ == Object) && (local_88 == '\x02')) {
    HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
              ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,
               (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_98.array_);
  }
  else {
    if (pVVar9->type_ != Array) {
      Value<char16_t>::reset(pVVar9);
      pVVar9->type_ = Array;
    }
    uVar3 = (pVVar9->field_0).array_.capacity_;
    if ((pVVar9->field_0).array_.index_ == uVar3) {
      Array<Qentem::Value<char16_t>_>::resize
                ((Array<Qentem::Value<char16_t>_> *)pVVar9,(uVar3 == 0 | uVar3) * 2);
    }
    pVVar2 = (pVVar9->field_0).array_.storage_ + (pVVar9->field_0).array_.index_;
    (pVVar2->field_0).array_.storage_ = (Value<char16_t> *)0x0;
    *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
    pVVar2->type_ = Undefined;
    Value<char16_t>::copyValue(pVVar2,(Value<char16_t> *)&local_98.array_);
    pSVar1 = &(pVVar9->field_0).array_.index_;
    *pSVar1 = *pSVar1 + 1;
  }
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = 
  L"<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>";
  local_a8 = 0x55;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>"
             ,0x55,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[65]>
            (test,&local_58,
             (char16_t (*) [65])L"4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, ",
             0xb85);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_c8.array_,(StringStream<char16_t> *)&local_d8,
             L"{\"group\":[[10],[20],[30]]}",0x1a);
  pTVar5 = local_d8.storage_;
  if (local_d8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_d8.storage_);
  }
  operator_delete(pTVar5);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_48.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = 
  L"<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
  ;
  local_a8 = 0x59;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
             ,0x59,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_58,(char16_t (*) [7])L"102030",0xb8b);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_c8.array_,(StringStream<char16_t> *)&local_d8,L"{\"group\":[1,2,3,4]}"
             ,0x13);
  pTVar5 = local_d8.storage_;
  if (local_d8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_d8.storage_);
  }
  operator_delete(pTVar5);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_48.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>";
  local_a8 = 0x30;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>",0x30,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_58,(char16_t (*) [5])L"1234",0xb91);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_c8.array_,(StringStream<char16_t> *)&local_d8,
             L"{\"numbers\":[1,2,3,4,5,6,7,8]}",0x1d);
  pTVar5 = local_d8.storage_;
  if (local_d8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_d8.storage_);
  }
  operator_delete(pTVar5);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_48.array_,(Value<char16_t> *)&local_c8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_c8.array_);
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B";
  local_a8 = 0x36;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B",0x36,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_58,(char16_t (*) [11])L"A12345678B",0xb96);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_d8.storage_ = (TagBit *)0x0;
  local_d8.index_ = 0;
  local_d8.capacity_ = 0;
  local_c8.array_.storage_ = (Value<char16_t> *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  local_b0 = L"<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>";
  local_a8 = 0x37;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>",0x37,&local_d8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_c8.array_,&local_d8,(Value<char16_t> *)&local_48.array_,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_d8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[113]>
            (test,&local_58,
             (char16_t (*) [113])
             L"{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}"
             ,0xb9d);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_98.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_48.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  pcVar7 = local_58.storage_;
  if (local_58.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar7);
  return;
}

Assistant:

static void TestLoopUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value1;
    Value<char16_t>        value3;
    const char16_t        *content;

    value1 += 100;
    value1 += -50;
    value1 += uR"(Qentem)";
    value1 += true;
    value1 += false;
    value1 += nullptr;
    value1 += 3;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, Qentem, true, false, null, 3, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value    =    "loop1-value">{var:loop1-value}, {var:loop1-value} </loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"(100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 )", __LINE__);
    ss.Clear();

    ////////////////

    value1.Reset();
    value1 += 0;
    value1 += 1;

    content =
        uR"(<loop value="loop1-value"><loop value="loop2-value">({var:loop1-value}: {var:loop2-value}) </loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"((0: 0) (0: 1) (1: 0) (1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"><loop value="loop2-value"><loop
                 value="loop3-value">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"((0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value='loop1-value'><loop value='loop2-value'><loop
                 value='loop3-value'><loop value='loop4-value'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>)";
    test.IsEqual(
        Template::Render(content, value1, ss),
        uR"((0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) )",
        __LINE__);
    ss.Clear();

    //////////////////////

    value1 = JSON::Parse(uR"([100, -50, "A", true, false, null])");
    const Value<char16_t> value2 =
        JSON::Parse(uR"({"k-1": 4, "k-2":1.5, "k-3":"ABC", "k-4":true, "k-5":false, "k-6":null})");

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value" >{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"set="arr1">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set='arr1' value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3.Reset();
    value3[uR"(arr1)"][uR"(arr2)"][uR"(arr3)"] = value1;

    content = uR"(<loop set="arr1[arr2][arr3]" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][0] += value2;

    content = uR"(<loop set="0[0][0]"value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[uR"(k1)"][0][uR"(k3)"] = value1;

    content = uR"(<loop value="loop1-value" set="k1[0][k3]">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][uR"(k2)"] += value2;

    content = uR"(<loop set="0[k2][0]"value="loop1-value">{var:loop1-value}, {var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss),
                 uR"(4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, )", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[[10],[20],[30]]})");

    content = uR"(<loop set="group" value="Val_1"><loop set="Val_1" value="Val_2">{var:Val_2}</loop></loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(102030)", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[1,2,3,4]})");

    content = uR"(<loop set="group" value="Val_">{var:Val_}</loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(1234)", __LINE__);
    ss.Clear();

    value3  = JSON::Parse(uR"({"numbers":[1,2,3,4,5,6,7,8]})");
    content = uR"(A<loop set="numbers" value="l_id1">{var:l_id1}</loop>B)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(A12345678B)", __LINE__);
    ss.Clear();

    content = uR"(<loop set="numbers" value="l_id1">{var:l_id1[0]}</loop>)";
    test.IsEqual(
        Template::Render(content, value3, ss),
        uR"({var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]})",
        __LINE__);
    ss.Clear();
}